

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

void __thiscall higan::MultiplexEpoll::UpdateChannel(MultiplexEpoll *this,Channel *channel)

{
  bool bVar1;
  ChannelStatus CVar2;
  LogLevel LVar3;
  Logger local_238;
  uint local_1c;
  Channel *pCStack_18;
  int event;
  Channel *channel_local;
  MultiplexEpoll *this_local;
  
  if (channel != (Channel *)0x0) {
    local_1c = 0;
    pCStack_18 = channel;
    channel_local = (Channel *)this;
    bVar1 = Channel::GetRegisterWritable(channel);
    local_1c = local_1c | (uint)bVar1 << 2;
    bVar1 = Channel::GetRegisterReadable(pCStack_18);
    local_1c = local_1c | bVar1;
    CVar2 = Channel::GetChannelStatus(pCStack_18);
    if (CVar2 == CHANNEL_NOT_ADDED) {
      if (local_1c == 0) {
        LVar3 = Logger::GetLogLevel();
        if ((int)LVar3 < 3) {
          Logger::Logger(&local_238,WARN,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                         ,0x83,"UpdateChannel");
          Logger::operator<<(&local_238,"CHANNEL_NOT_ADDED but no event");
          Logger::~Logger(&local_238);
        }
      }
      else {
        UpdateChannelEvent(this,pCStack_18,local_1c,1);
        Channel::SetChannelStatus(pCStack_18,CHANNEL_ADDED);
      }
    }
    else if (CVar2 == CHANNEL_ADDED) {
      if (local_1c == 0) {
        UpdateChannelEvent(this,pCStack_18,0,3);
      }
      else {
        UpdateChannelEvent(this,pCStack_18,0,2);
        Channel::SetChannelStatus(pCStack_18,CHANNEL_NOT_ADDED);
      }
    }
  }
  return;
}

Assistant:

void MultiplexEpoll::UpdateChannel(Channel* channel)
{
	if (!channel)
	{
		return;
	}

	int event = EPOLL_DEFAULT_EVENT;
	event |= channel->GetRegisterWritable() ? EPOLLOUT : 0;
	event |= channel->GetRegisterReadable() ? EPOLLIN : 0;

	/**
	 * 当Channel未被注册时 如果没有设定事件则错误 设定了事件则添加Channel
	 * 当Channel注册后, 如果事件为空则清除Channel, 否则修改注册事件
	 */

	switch (channel->GetChannelStatus())
	{
		case Channel::CHANNEL_NOT_ADDED:
		{
			if (event == EPOLL_DEFAULT_EVENT)
			{
				LOG_WARN << "CHANNEL_NOT_ADDED but no event";
			}
			else
			{
				UpdateChannelEvent(channel, event, EPOLL_CTL_ADD);
				channel->SetChannelStatus(Channel::CHANNEL_ADDED);
			}
			break;
		}
		case Channel::CHANNEL_ADDED:
		{
			if (event == EPOLL_DEFAULT_EVENT)
			{
				UpdateChannelEvent(channel, event, EPOLL_CTL_MOD);
			}
			else
			{
				UpdateChannelEvent(channel, 0, EPOLL_CTL_DEL);
				channel->SetChannelStatus(Channel::CHANNEL_NOT_ADDED);
			};
			break;
		}
	}
}